

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SslSocket.cpp
# Opt level: O0

bool __thiscall SslTcpSocketImpl::SetConnectState(SslTcpSocketImpl *this)

{
  pointer pSVar1;
  long lVar2;
  char *szFileName;
  SslTcpSocketImpl *local_68;
  offset_in_BaseSocketImpl_to_subr local_60 [2];
  type local_50;
  function<void_()> local_38;
  undefined1 local_18 [16];
  SslTcpSocketImpl *this_local;
  
  local_18._8_8_ = this;
  std::make_unique<OpenSSLWrapper::SslConnection,OpenSSLWrapper::SslClientContext&>
            ((SslClientContext *)local_18);
  std::
  unique_ptr<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>::
  operator=(&this->m_pSslCon,
            (unique_ptr<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
             *)local_18);
  std::
  unique_ptr<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>::
  ~unique_ptr((unique_ptr<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
               *)local_18);
  pSVar1 = std::
           unique_ptr<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
           ::operator->(&this->m_pSslCon);
  local_60[1] = 0;
  local_60[0] = 0x11;
  local_68 = this;
  std::bind<void(BaseSocketImpl::*)(),SslTcpSocketImpl*>(&local_50,local_60,&local_68);
  std::function<void()>::function<std::_Bind<void(BaseSocketImpl::*(SslTcpSocketImpl*))()>,void>
            ((function<void()> *)&local_38,&local_50);
  OpenSSLWrapper::SslConnection::SetErrorCb(pSVar1,&local_38);
  std::function<void_()>::~function(&local_38);
  pSVar1 = std::
           unique_ptr<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
           ::operator->(&this->m_pSslCon);
  OpenSSLWrapper::SslConnection::SetUserData(pSVar1,0,fnForwarder_abi_cxx11_);
  pSVar1 = std::
           unique_ptr<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
           ::operator->(&this->m_pSslCon);
  OpenSSLWrapper::SslConnection::SetUserData(pSVar1,1,this);
  lVar2 = std::__cxx11::string::size();
  if (lVar2 != 0) {
    pSVar1 = std::
             unique_ptr<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
             ::operator->(&this->m_pSslCon);
    szFileName = (char *)std::__cxx11::string::c_str();
    OpenSSLWrapper::SslConnection::SetTrustedRootCertificates(pSVar1,szFileName);
  }
  ConEstablished(this,&this->super_TcpSocketImpl);
  return true;
}

Assistant:

bool SslTcpSocketImpl::SetConnectState()
{
    m_pSslCon = make_unique<SslConnection>(m_pClientCtx);
    m_pSslCon->SetErrorCb(function<void()>(bind(&BaseSocketImpl::Close, this)));
    m_pSslCon->SetUserData(0, reinterpret_cast<void*>(&SslTcpSocketImpl::fnForwarder));
    m_pSslCon->SetUserData(1, this);

    if (m_strTrustRootCert.size() > 0)
        m_pSslCon->SetTrustedRootCertificates(m_strTrustRootCert.c_str());

    ConEstablished(this);
    return true;
}